

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseSpotLight(SpotLight *light,string *err,json *o)

{
  json *o_00;
  json *err_00;
  size_type *ret;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  json *local_20;
  json *o_local;
  string *err_local;
  SpotLight *light_local;
  
  local_20 = o;
  o_local = (json *)err;
  err_local = (string *)light;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"innerConeAngle",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"",&local_79);
  ParseNumberProperty(&light->innerConeAngle,err,o,&local_40,false,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  err_00 = o_local;
  o_00 = local_20;
  ret = &err_local->_M_string_length;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"outerConeAngle",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"",&local_c9);
  ParseNumberProperty((double *)ret,(string *)err_00,o_00,&local_a0,false,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  ParseExtensionsProperty((ExtensionMap *)&err_local->field_2,(string *)o_local,local_20);
  ParseExtrasProperty((Value *)(err_local + 2),local_20);
  return true;
}

Assistant:

static bool ParseSpotLight(SpotLight *light, std::string *err, const json &o) {
  ParseNumberProperty(&light->innerConeAngle, err, o, "innerConeAngle", false);
  ParseNumberProperty(&light->outerConeAngle, err, o, "outerConeAngle", false);

  ParseExtensionsProperty(&light->extensions, err, o);
  ParseExtrasProperty(&light->extras, o);

  // TODO(syoyo): Validate parameter values.

  return true;
}